

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes SzReadNumber32(CSzData *sd,UInt32 *value)

{
  ulong uStack_30;
  int __result__;
  UInt64 value64;
  UInt32 *pUStack_20;
  Byte firstByte;
  UInt32 *value_local;
  CSzData *sd_local;
  
  if (sd->Size == 0) {
    sd_local._4_4_ = 0x10;
  }
  else {
    value64._7_1_ = *sd->Data;
    if ((value64._7_1_ & 0x80) == 0) {
      *value = (uint)value64._7_1_;
      sd->Data = sd->Data + 1;
      sd->Size = sd->Size - 1;
      sd_local._4_4_ = 0;
    }
    else {
      pUStack_20 = value;
      value_local = (UInt32 *)sd;
      sd_local._4_4_ = ReadNumber(sd,&stack0xffffffffffffffd0);
      if (sd_local._4_4_ == 0) {
        if (uStack_30 < 0x7fffffff) {
          if (uStack_30 < 0x1000000000000000) {
            *pUStack_20 = (UInt32)uStack_30;
            sd_local._4_4_ = 0;
          }
          else {
            sd_local._4_4_ = 4;
          }
        }
        else {
          sd_local._4_4_ = 4;
        }
      }
    }
  }
  return sd_local._4_4_;
}

Assistant:

static MY_NO_INLINE SRes SzReadNumber32(CSzData *sd, UInt32 *value)
{
  Byte firstByte;
  UInt64 value64;
  if (sd->Size == 0)
    return SZ_ERROR_ARCHIVE;
  firstByte = *sd->Data;
  if ((firstByte & 0x80) == 0)
  {
    *value = firstByte;
    sd->Data++;
    sd->Size--;
    return SZ_OK;
  }
  RINOK(ReadNumber(sd, &value64));
  if (value64 >= (UInt32)0x80000000 - 1)
    return SZ_ERROR_UNSUPPORTED;
  if (value64 >= ((UInt64)(1) << ((sizeof(size_t) - 1) * 8 + 4)))
    return SZ_ERROR_UNSUPPORTED;
  *value = (UInt32)value64;
  return SZ_OK;
}